

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bake_test.c
# Opt level: O0

bool_t bakeTest(void)

{
  err_t eVar1;
  bool_t bVar2;
  size_t sVar3;
  octet iv [64];
  octet secret [32];
  octet keyb [32];
  octet keya [32];
  char pwd [5];
  file_msg_st fileb [1];
  file_msg_st filea [1];
  bake_cert certb [1];
  bake_cert certa [1];
  octet certdatab [72];
  octet certdataa [72];
  octet db [32];
  octet da [32];
  bake_settings settingsb [1];
  bake_settings settingsa [1];
  octet echob [64];
  octet echoa [64];
  octet randb [48];
  octet randa [48];
  bign_params params [1];
  err_t codeb;
  err_t codea;
  bign_params *in_stack_fffffffffffffa78;
  code *pcVar4;
  void *in_stack_fffffffffffffa80;
  code *pcVar5;
  undefined8 *dest;
  char *hex;
  octet *msg;
  undefined7 in_stack_fffffffffffffa90;
  undefined1 in_stack_fffffffffffffa97;
  undefined1 uVar6;
  octet *pt;
  octet *iv_00;
  undefined4 *secret_len;
  bake_cert *in_stack_fffffffffffffab0;
  bake_cert *in_stack_fffffffffffffab8;
  octet *poVar7;
  octet *in_stack_fffffffffffffac0;
  octet *pwd_00;
  bake_settings *in_stack_fffffffffffffac8;
  bake_settings *pbVar8;
  bign_params *in_stack_fffffffffffffad0;
  bign_params *pbVar9;
  octet *in_stack_fffffffffffffad8;
  octet *key;
  read_i in_stack_fffffffffffffaf0;
  write_i p_Var10;
  undefined7 in_stack_fffffffffffffaf8;
  undefined1 in_stack_fffffffffffffaff;
  void *in_stack_fffffffffffffb00;
  bake_certval_i vala;
  bake_settings *settings;
  undefined7 in_stack_fffffffffffffb20;
  read_i read;
  read_i read_00;
  write_i in_stack_fffffffffffffb48;
  void *in_stack_fffffffffffffb50;
  octet local_458 [32];
  octet local_438 [43];
  undefined1 local_40d [21];
  undefined8 local_3f8;
  undefined8 local_3f0;
  undefined1 *local_3e8;
  ulong local_3e0;
  code *local_3d8;
  undefined1 *local_3c8;
  ulong local_3c0;
  code *local_3b8;
  undefined1 local_3a8 [80];
  undefined1 local_358 [144];
  undefined4 local_2c8;
  undefined4 local_2c4;
  code *local_2a0;
  undefined1 *local_298;
  undefined4 local_288;
  undefined4 local_284;
  code *local_260;
  undefined1 *local_258;
  undefined1 local_248 [128];
  undefined1 local_1c8 [96];
  octet local_168 [348];
  err_t local_c;
  err_t local_8;
  bool_t local_4;
  
  local_40d._0_4_ = 0x36383038;
  local_40d[4] = 0;
  sVar3 = prngEcho_keep();
  if (sVar3 < 0x41) {
    eVar1 = bignParamsStd(in_stack_fffffffffffffa78,(char *)0x107a09);
    if (eVar1 == 0) {
      memSet(in_stack_fffffffffffffa80,(octet)((ulong)in_stack_fffffffffffffa78 >> 0x38),0x107a32);
      memSet(in_stack_fffffffffffffa80,(octet)((ulong)in_stack_fffffffffffffa78 >> 0x38),0x107a46);
      local_284 = 1;
      local_288 = 1;
      local_2c4 = 1;
      local_2c8 = 1;
      local_2a0 = prngEchoStepR;
      local_260 = prngEchoStepR;
      local_258 = local_248 + 0x40;
      local_298 = local_248;
      hexTo(in_stack_fffffffffffffa80,(char *)in_stack_fffffffffffffa78);
      hexTo(in_stack_fffffffffffffa80,(char *)in_stack_fffffffffffffa78);
      hexTo(in_stack_fffffffffffffa80,(char *)in_stack_fffffffffffffa78);
      hexTo(in_stack_fffffffffffffa80,(char *)in_stack_fffffffffffffa78);
      local_3c8 = local_358;
      sVar3 = strLen((char *)0x107b1c);
      local_3c0 = sVar3 >> 1;
      local_3e8 = local_3a8;
      sVar3 = strLen((char *)0x107b43);
      local_3e0 = sVar3 >> 1;
      local_3d8 = bakeTestCertVal;
      local_3b8 = bakeTestCertVal;
      hexTo(in_stack_fffffffffffffa80,(char *)in_stack_fffffffffffffa78);
      hexTo(in_stack_fffffffffffffa80,(char *)in_stack_fffffffffffffa78);
      fileMsgFlash();
      do {
        local_3f0 = 0;
        local_3f8 = 0;
        local_40d._13_8_ = 0;
        local_40d._5_8_ = 0;
        poVar7 = local_248 + 0x40;
        read = (read_i)(local_1c8 + 0x30);
        sVar3 = strLen((char *)0x107bf5);
        prngEchoStart(poVar7,read,sVar3 >> 1);
        p_Var10 = (write_i)local_248;
        read_00 = (read_i)local_1c8;
        sVar3 = strLen((char *)0x107c3c);
        prngEchoStart(p_Var10,read_00,sVar3 >> 1);
        local_c = bakeBMQVRunB(in_stack_fffffffffffffad8,in_stack_fffffffffffffad0,
                               in_stack_fffffffffffffac8,in_stack_fffffffffffffac0,
                               in_stack_fffffffffffffab8,in_stack_fffffffffffffab0,
                               in_stack_fffffffffffffaf0,
                               (write_i)CONCAT17(in_stack_fffffffffffffaff,in_stack_fffffffffffffaf8
                                                ),in_stack_fffffffffffffb00);
        if ((local_c != 0) && (local_c != 0xca)) {
          return 0;
        }
        hex = (char *)&local_3f8;
        pcVar4 = fileMsgRead;
        pcVar5 = fileMsgWrite;
        local_8 = bakeBMQVRunA(in_stack_fffffffffffffad8,in_stack_fffffffffffffad0,
                               in_stack_fffffffffffffac8,in_stack_fffffffffffffac0,
                               in_stack_fffffffffffffab8,in_stack_fffffffffffffab0,
                               in_stack_fffffffffffffaf0,
                               (write_i)CONCAT17(in_stack_fffffffffffffaff,in_stack_fffffffffffffaf8
                                                ),in_stack_fffffffffffffb00);
        if ((local_8 != 0) && (local_8 != 0xca)) {
          return 0;
        }
        uVar6 = local_8 == 0xca || local_c == 0xca;
      } while ((bool)uVar6);
      bVar2 = memEq(local_438,local_458,0x20);
      if ((bVar2 == 0) ||
         (bVar2 = hexEq((void *)CONCAT17(in_stack_fffffffffffffa97,in_stack_fffffffffffffa90),hex),
         bVar2 == 0)) {
        local_4 = 0;
      }
      else {
        hexTo(pcVar5,(char *)pcVar4);
        hexTo(pcVar5,(char *)pcVar4);
        fileMsgFlash();
        do {
          local_3f0 = 0;
          local_3f8 = 0;
          local_40d._13_8_ = 0;
          local_40d._5_8_ = 0;
          vala = (bake_certval_i)(local_248 + 0x40);
          pbVar8 = (bake_settings *)(local_1c8 + 0x30);
          sVar3 = strLen((char *)0x107e72);
          prngEchoStart(vala,pbVar8,sVar3 >> 1);
          pbVar9 = (bign_params *)local_248;
          settings = (bake_settings *)local_1c8;
          sVar3 = strLen((char *)0x107eb9);
          prngEchoStart(pbVar9,settings,sVar3 >> 1);
          local_c = bakeBSTSRunB(poVar7,(bign_params *)CONCAT17(uVar6,in_stack_fffffffffffffb20),
                                 settings,(octet *)pbVar9,(bake_cert *)pbVar8,vala,read_00,
                                 in_stack_fffffffffffffb48,in_stack_fffffffffffffb50);
          if ((local_c != 0) && (local_c != 0xca)) {
            return 0;
          }
          msg = (octet *)&local_3f8;
          pcVar4 = fileMsgRead;
          pcVar5 = fileMsgWrite;
          local_8 = bakeBSTSRunA((octet *)settings,pbVar9,pbVar8,(octet *)vala,
                                 (bake_cert *)
                                 CONCAT17(in_stack_fffffffffffffaff,in_stack_fffffffffffffaf8),
                                 (bake_certval_i)in_stack_fffffffffffffaf0,read,p_Var10,read_00);
          if ((local_8 != 0) && (local_8 != 0xca)) {
            return 0;
          }
          in_stack_fffffffffffffaff = local_8 == 0xca || local_c == 0xca;
        } while ((bool)in_stack_fffffffffffffaff);
        bVar2 = memEq(local_438,local_458,0x20);
        if ((bVar2 == 0) ||
           (bVar2 = hexEq((void *)CONCAT17(in_stack_fffffffffffffa97,in_stack_fffffffffffffa90),
                          (char *)msg), bVar2 == 0)) {
          local_4 = 0;
        }
        else {
          hexTo(pcVar5,(char *)pcVar4);
          hexTo(pcVar5,(char *)pcVar4);
          fileMsgFlash();
          do {
            local_3f0 = 0;
            local_3f8 = 0;
            local_40d._13_8_ = 0;
            local_40d._5_8_ = 0;
            poVar7 = local_248 + 0x40;
            pwd_00 = local_1c8 + 0x30;
            sVar3 = strLen((char *)0x1080e7);
            prngEchoStart(poVar7,pwd_00,sVar3 >> 1);
            pbVar8 = (bake_settings *)local_248;
            pbVar9 = (bign_params *)local_1c8;
            sVar3 = strLen((char *)0x108122);
            prngEchoStart(pbVar8,pbVar9,sVar3 >> 1);
            key = local_458;
            p_Var10 = (write_i)local_40d;
            strLen((char *)0x108178);
            local_c = bakeBPACERunB(key,pbVar9,pbVar8,pwd_00,(size_t)poVar7,
                                    (read_i)in_stack_fffffffffffffab0,p_Var10,
                                    (void *)CONCAT17(in_stack_fffffffffffffaff,
                                                     in_stack_fffffffffffffaf8));
            if ((local_c != 0) && (local_c != 0xca)) {
              return 0;
            }
            pt = local_438;
            iv_00 = local_168;
            secret_len = &local_288;
            in_stack_fffffffffffffab0 = (bake_cert *)local_40d;
            strLen((char *)0x108222);
            dest = &local_3f8;
            pcVar4 = fileMsgWrite;
            local_8 = bakeBPACERunA(key,pbVar9,pbVar8,pwd_00,(size_t)poVar7,
                                    (read_i)in_stack_fffffffffffffab0,p_Var10,
                                    (void *)CONCAT17(in_stack_fffffffffffffaff,
                                                     in_stack_fffffffffffffaf8));
            if ((local_8 != 0) && (local_8 != 0xca)) {
              return 0;
            }
            uVar6 = local_8 == 0xca || local_c == 0xca;
          } while ((bool)uVar6);
          bVar2 = memEq(local_438,local_458,0x20);
          if ((bVar2 == 0) ||
             (bVar2 = hexEq((void *)CONCAT17(uVar6,in_stack_fffffffffffffa90),(char *)msg),
             bVar2 == 0)) {
            local_4 = 0;
          }
          else {
            hexTo(dest,(char *)pcVar4);
            hexTo(dest,(char *)pcVar4);
            eVar1 = bakeKDF(poVar7,(octet *)in_stack_fffffffffffffab0,(size_t)secret_len,iv_00,
                            (size_t)pt,CONCAT17(uVar6,in_stack_fffffffffffffa90));
            if ((((eVar1 == 0) &&
                 (eVar1 = bakeKDF(poVar7,(octet *)in_stack_fffffffffffffab0,(size_t)secret_len,iv_00
                                  ,(size_t)pt,CONCAT17(uVar6,in_stack_fffffffffffffa90)), eVar1 == 0
                 )) && (bVar2 = hexEq((void *)CONCAT17(uVar6,in_stack_fffffffffffffa90),(char *)msg)
                       , bVar2 != 0)) &&
               (bVar2 = hexEq((void *)CONCAT17(uVar6,in_stack_fffffffffffffa90),(char *)msg),
               bVar2 != 0)) {
              hexTo(dest,(char *)pcVar4);
              eVar1 = bakeSWU(pt,(bign_params *)CONCAT17(uVar6,in_stack_fffffffffffffa90),msg);
              if ((eVar1 == 0) &&
                 (bVar2 = hexEq((void *)CONCAT17(uVar6,in_stack_fffffffffffffa90),(char *)msg),
                 bVar2 != 0)) {
                local_4 = 1;
              }
              else {
                local_4 = 0;
              }
            }
            else {
              local_4 = 0;
            }
          }
        }
      }
    }
    else {
      local_4 = 0;
    }
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

bool_t bakeTest()
{
	err_t codea;
	err_t codeb;
	bign_params params[1];
	octet randa[48];
	octet randb[48];
	octet echoa[64];
	octet echob[64];
	bake_settings settingsa[1];
	bake_settings settingsb[1];
	octet da[32];
	octet db[32];
	octet certdataa[5 /* Alice */ + 64 + 3 /* align */];
	octet certdatab[3 /* Bob */ + 64 + 5 /* align */];
	bake_cert certa[1];
	bake_cert certb[1];
	file_msg_st filea[1];
	file_msg_st fileb[1];
	const char pwd[] = "8086";
	octet keya[32];
	octet keyb[32];
	octet secret[32];
	octet iv[64];
	// подготовить память
	if (sizeof(echoa) < prngEcho_keep())
		return FALSE;
	// загрузить долговременные параметры
	if (bignParamsStd(params, "1.2.112.0.2.0.34.101.45.3.1") != ERR_OK)
		return FALSE;
	// задать настройки
	memSetZero(settingsa, sizeof(bake_settings));
	memSetZero(settingsb, sizeof(bake_settings));
	settingsa->kca = settingsa->kcb = TRUE;
	settingsb->kca = settingsb->kcb = TRUE;
	settingsa->rng = settingsb->rng = prngEchoStepR;
	settingsa->rng_state = echoa;
	settingsb->rng_state = echob;
	// загрузить личные ключи
	hexTo(da, _da);
	hexTo(db, _db);
	// загрузить сертификаты
	hexTo(certdataa, _certa);
	hexTo(certdatab, _certb);
	certa->data = certdataa;
	certa->len = strLen(_certa) / 2;
	certb->data = certdatab;
	certb->len = strLen(_certb) / 2;
	certa->val = certb->val = bakeTestCertVal;
	// тест Б.2
	hexTo(randa, _bmqv_randa);
	hexTo(randb, _bmqv_randb);
	fileMsgFlash();
	do
	{
		filea->i = filea->offset = 0;
		fileb->i = fileb->offset = 0;
		prngEchoStart(echoa, randa, strLen(_bmqv_randb) / 2);
		prngEchoStart(echob, randb, strLen(_bmqv_randb) / 2);
		codeb = bakeBMQVRunB(keyb, params, settingsb, db, certb, certa,
			fileMsgRead, fileMsgWrite, fileb);
		if (codeb != ERR_OK && codeb != ERR_FILE_NOT_FOUND)
			return FALSE;
		codea = bakeBMQVRunA(keya, params, settingsa, da, certa, certb,
			fileMsgRead, fileMsgWrite, filea);
		if (codea != ERR_OK && codea != ERR_FILE_NOT_FOUND)
			return FALSE;
	}
	while (codea == ERR_FILE_NOT_FOUND || codeb == ERR_FILE_NOT_FOUND);
	if (!memEq(keya, keyb, 32) ||
		!hexEq(keya,
			"C6F86D0E468D5EF1A9955B2EE0CF0581"
			"050C81D1B47727092408E863C7EEB48C"))
		return FALSE;
	// тест Б.3
	hexTo(randa, _bsts_randa);
	hexTo(randb, _bsts_randb);
	fileMsgFlash();
	do
	{
		filea->i = filea->offset = 0;
		fileb->i = fileb->offset = 0;
		prngEchoStart(echoa, randa, strLen(_bsts_randb) / 2);
		prngEchoStart(echob, randb, strLen(_bsts_randb) / 2);
		codeb = bakeBSTSRunB(keyb, params, settingsb, db, certb,
			bakeTestCertVal, fileMsgRead, fileMsgWrite, fileb);
		if (codeb != ERR_OK && codeb != ERR_FILE_NOT_FOUND)
			return FALSE;
		codea = bakeBSTSRunA(keya, params, settingsa, da, certa,
			bakeTestCertVal, fileMsgRead, fileMsgWrite, filea);
		if (codea != ERR_OK && codea != ERR_FILE_NOT_FOUND)
			return FALSE;
	}
	while (codea == ERR_FILE_NOT_FOUND || codeb == ERR_FILE_NOT_FOUND);
	if (!memEq(keya, keyb, 32) ||
		!hexEq(keya,
			"78EF2C56BD6DA2116BB5BEE80CEE5C05"
			"394E7609183CF7F76DF0C2DCFB25C4AD"))
		return FALSE;
	// тест Б.4
	hexTo(randa, _bpace_randa);
	hexTo(randb, _bpace_randb);
	fileMsgFlash();
	do
	{
		filea->i = filea->offset = 0;
		fileb->i = fileb->offset = 0;
		prngEchoStart(echoa, randa, strLen(_bpace_randb) / 2);
		prngEchoStart(echob, randb, strLen(_bpace_randb) / 2);
		codeb = bakeBPACERunB(keyb, params, settingsb, (const octet*)pwd,
			strLen(pwd), fileMsgRead, fileMsgWrite, fileb);
		if (codeb != ERR_OK && codeb != ERR_FILE_NOT_FOUND)
			return FALSE;
		codea = bakeBPACERunA(keya, params, settingsa, (const octet*)pwd,
			strLen(pwd), fileMsgRead, fileMsgWrite, filea);
		if (codea != ERR_OK && codea != ERR_FILE_NOT_FOUND)
			return FALSE;
	}
	while (codea == ERR_FILE_NOT_FOUND || codeb == ERR_FILE_NOT_FOUND);
	if (!memEq(keya, keyb, 32) ||
		!hexEq(keya,
			"DAC4D8F411F9C523D28BBAAB32A5270E"
			"4DFA1F0F757EF8E0F30AF08FBDE1E7F4"))
		return FALSE;
	// тест bakeKDF (по данным из теста Б.4)
	hexTo(secret, 
		"723356E335ED70620FFB1842752092C3"
		"2603EB666040920587D800575BECFC42");
	hexTo(iv, 
		"6B13ACBB086FB87618BCC2EF20A3FA89"
		"475654CB367E670A2441730B24B8AB31"
		"CD3D6487DC4EEB23456978186A069C71"
		"375D75C2DF198BAD1E61EEA0DBBFF737");
	if (bakeKDF(keya, secret, 32, iv, 64, 0) != ERR_OK ||
		bakeKDF(keyb, secret, 32, iv, 64, 1) != ERR_OK ||
		!hexEq(keya,
			"DAC4D8F411F9C523D28BBAAB32A5270E"
			"4DFA1F0F757EF8E0F30AF08FBDE1E7F4") ||
		!hexEq(keyb,
			"54AC058284D679CF4C47D3D72651F3E4"
			"EF0D61D1D0ED5BAF8FF30B8924E599D8"))
		return FALSE;
	// тест bakeSWU (по данным из теста Б.4)
	hexTo(secret, 
		"AD1362A8F9A3D42FBE1B8E6F1C88AAD5"
		"0F51D91347617C20BD4AB07AEF4F26A1");
	if (bakeSWU(iv, params, secret) != ERR_OK ||
		!hexEq(iv,
			"014417D3355557317D2E2AB6D0875487"
			"8D19E8D97B71FDC95DBB2A9B894D16D7"
			"7704A0B5CAA9CDA10791E4760671E105"
			"0DDEAB7083A7458447866ADB01473810"))
		return FALSE;
	// все нормально
	return TRUE;
}